

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O1

__m256 * __thiscall
Sphere::intersect(__m256 *__return_storage_ptr__,Sphere *this,Ray8 *ray,DiffGeom8 *dg)

{
  Sphere SVar1;
  Sphere SVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [32];
  ulong uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  __m256 *pafVar14;
  ulong uVar15;
  undefined1 auVar16 [32];
  undefined1 auVar18 [32];
  float fVar19;
  undefined1 auVar20 [16];
  __m256 b;
  undefined1 auVar21 [32];
  float fVar22;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  __m256 c;
  undefined1 auVar23 [32];
  float fVar32;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar33 [32];
  __m256 a;
  undefined1 auVar34 [32];
  __m256 t1;
  __m256 t0;
  __m256 local_a0;
  __m256 local_80 [2];
  undefined1 auVar17 [32];
  
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(*__return_storage_ptr__ + 2);
  fVar19 = (float)*(ulong *)(*__return_storage_ptr__ + 2);
  c[1] = fVar19;
  c[0] = fVar19;
  c[2] = fVar19;
  c[3] = fVar19;
  c[4] = fVar19;
  c[5] = fVar19;
  c[6] = fVar19;
  c[7] = fVar19;
  auVar20 = vmovshdup_avx(auVar20);
  b._0_8_ = auVar20._0_8_;
  b[2] = (float)(int)b._0_8_;
  b[3] = (float)(int)((ulong)b._0_8_ >> 0x20);
  b[4] = (float)(int)b._0_8_;
  b[5] = (float)(int)((ulong)b._0_8_ >> 0x20);
  b[6] = (float)(int)b._0_8_;
  b[7] = (float)(int)((ulong)b._0_8_ >> 0x20);
  fVar19 = (*__return_storage_ptr__)[4];
  a[1] = fVar19;
  a[0] = fVar19;
  a[2] = fVar19;
  a[3] = fVar19;
  a[4] = fVar19;
  a[5] = fVar19;
  a[6] = fVar19;
  a[7] = fVar19;
  auVar18 = vsubps_avx((undefined1  [32])c,(undefined1  [32])*this);
  auVar17 = vsubps_avx((undefined1  [32])b,(undefined1  [32])this[1]);
  auVar16 = vsubps_avx((undefined1  [32])a,(undefined1  [32])this[2]);
  fVar19 = *(float *)&this[3].super_Geometry._vptr_Geometry;
  fVar22 = *(float *)((long)&this[3].super_Geometry._vptr_Geometry + 4);
  fVar24 = this[3].pos.x;
  fVar25 = this[3].pos.y;
  fVar26 = this[3].pos.z;
  fVar27 = this[3].radius;
  fVar28 = (float)this[3].material_id;
  SVar1 = this[4];
  SVar2 = this[5];
  auVar21._4_4_ = fVar22 * fVar22;
  auVar21._0_4_ = fVar19 * fVar19;
  auVar21._8_4_ = fVar24 * fVar24;
  auVar21._12_4_ = fVar25 * fVar25;
  auVar21._16_4_ = fVar26 * fVar26;
  auVar21._20_4_ = fVar27 * fVar27;
  auVar21._24_4_ = fVar28 * fVar28;
  auVar21._28_4_ = auVar20._4_4_;
  auVar20 = vfmadd231ps_fma(auVar21,(undefined1  [32])SVar1,(undefined1  [32])SVar1);
  auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),(undefined1  [32])SVar2,(undefined1  [32])SVar2);
  auVar21 = ZEXT1632(auVar20);
  fVar29 = auVar18._0_4_;
  fVar32 = auVar18._4_4_;
  auVar11._4_4_ = fVar32 * fVar22;
  auVar11._0_4_ = fVar29 * fVar19;
  fVar22 = auVar18._8_4_;
  auVar11._8_4_ = fVar22 * fVar24;
  fVar24 = auVar18._12_4_;
  auVar11._12_4_ = fVar24 * fVar25;
  fVar25 = auVar18._16_4_;
  auVar11._16_4_ = fVar25 * fVar26;
  fVar26 = auVar18._20_4_;
  auVar11._20_4_ = fVar26 * fVar27;
  fVar27 = auVar18._24_4_;
  auVar11._24_4_ = fVar27 * fVar28;
  auVar11._28_4_ = *(undefined4 *)&this[3].field_0x1c;
  auVar20 = vfmadd231ps_fma(auVar11,auVar17,(undefined1  [32])SVar1);
  auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar16,(undefined1  [32])SVar2);
  auVar9._8_4_ = 0xc0000000;
  auVar9._0_8_ = 0xc0000000c0000000;
  auVar9._12_4_ = 0xc0000000;
  auVar9._16_4_ = 0xc0000000;
  auVar9._20_4_ = 0xc0000000;
  auVar9._24_4_ = 0xc0000000;
  auVar9._28_4_ = 0xc0000000;
  vmulps_avx512vl(ZEXT1632(auVar20),auVar9);
  fVar19 = (*__return_storage_ptr__)[5];
  auVar34._4_4_ = fVar19;
  auVar34._0_4_ = fVar19;
  auVar34._8_4_ = fVar19;
  auVar34._12_4_ = fVar19;
  auVar34._16_4_ = fVar19;
  auVar34._20_4_ = fVar19;
  auVar34._24_4_ = fVar19;
  auVar34._28_4_ = fVar19;
  auVar12._4_4_ = fVar32 * fVar32;
  auVar12._0_4_ = fVar29 * fVar29;
  auVar12._8_4_ = fVar22 * fVar22;
  auVar12._12_4_ = fVar24 * fVar24;
  auVar12._16_4_ = fVar25 * fVar25;
  auVar12._20_4_ = fVar26 * fVar26;
  auVar12._24_4_ = fVar27 * fVar27;
  auVar12._28_4_ = auVar18._28_4_;
  auVar20 = vfmadd231ps_fma(auVar12,auVar17,auVar17);
  auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar16,auVar16);
  vfnmadd231ps_fma(ZEXT1632(auVar20),auVar34,auVar34);
  local_a0 = (__m256)(ZEXT832(0) << 0x20);
  local_80[0] = local_a0;
  pafVar14 = solve_quadratic(local_80,a,b,c,&local_a0,(__m256 *)ray);
  uVar15 = vcmpps_avx512vl((undefined1  [32])local_80[0],(undefined1  [32])this[6],1);
  bVar3 = (bool)((byte)uVar15 & 1);
  auVar16._0_4_ = (uint)bVar3 * (int)local_a0[0] | (uint)!bVar3 * (int)local_80[0][0];
  bVar3 = (bool)((byte)(uVar15 >> 1) & 1);
  auVar16._4_4_ = (uint)bVar3 * (int)local_a0[1] | (uint)!bVar3 * (int)local_80[0][1];
  bVar3 = (bool)((byte)(uVar15 >> 2) & 1);
  auVar16._8_4_ = (uint)bVar3 * (int)local_a0[2] | (uint)!bVar3 * (int)local_80[0][2];
  bVar3 = (bool)((byte)(uVar15 >> 3) & 1);
  auVar16._12_4_ = (uint)bVar3 * (int)local_a0[3] | (uint)!bVar3 * (int)local_80[0][3];
  bVar3 = (bool)((byte)(uVar15 >> 4) & 1);
  auVar16._16_4_ = (uint)bVar3 * (int)local_a0[4] | (uint)!bVar3 * (int)local_80[0][4];
  bVar3 = (bool)((byte)(uVar15 >> 5) & 1);
  auVar16._20_4_ = (uint)bVar3 * (int)local_a0[5] | (uint)!bVar3 * (int)local_80[0][5];
  bVar3 = (bool)((byte)(uVar15 >> 6) & 1);
  auVar16._24_4_ = (uint)bVar3 * (int)local_a0[6] | (uint)!bVar3 * (int)local_80[0][6];
  bVar3 = SUB81(uVar15 >> 7,0);
  auVar16._28_4_ = (uint)bVar3 * (int)local_a0[7] | (uint)!bVar3 * (int)local_80[0][7];
  SVar1 = this[7];
  uVar15 = vcmpps_avx512vl(auVar16,(undefined1  [32])SVar1,1);
  uVar10 = vcmpps_avx512vl((undefined1  [32])this[6],auVar16,1);
  uVar15 = uVar15 & uVar10;
  auVar17 = vmovdqa32_avx512vl(auVar21);
  auVar18._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar17._4_4_;
  auVar18._0_4_ = (uint)((byte)uVar15 & 1) * auVar17._0_4_;
  auVar18._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar17._8_4_;
  auVar18._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar17._12_4_;
  auVar18._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar17._16_4_;
  auVar18._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar17._20_4_;
  auVar18._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar17._24_4_;
  fVar19 = (float)((uint)(byte)(uVar15 >> 7) * auVar17._28_4_);
  auVar18._28_4_ = fVar19;
  auVar17 = vpand_avx2(auVar18,(undefined1  [32])this[8]);
  auVar18 = (undefined1  [32])this[8] & auVar18;
  if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar18 >> 0x7f,0) != '\0') ||
        (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar18 >> 0xbf,0) != '\0') ||
      (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar18[0x1f] < '\0') {
    SVar2 = (Sphere)vblendvps_avx((undefined1  [32])SVar1,auVar16,auVar17);
    this[7] = SVar2;
    fVar22 = SVar2.super_Geometry._vptr_Geometry._0_4_;
    fVar24 = SVar2.super_Geometry._vptr_Geometry._4_4_;
    fVar25 = SVar2.pos.x;
    fVar26 = SVar2.pos.y;
    fVar27 = SVar2.pos.z;
    fVar28 = SVar2.radius;
    fVar29 = (float)SVar2.material_id;
    auVar30._0_4_ =
         fVar22 * *(float *)&this[3].super_Geometry._vptr_Geometry +
         *(float *)&(this->super_Geometry)._vptr_Geometry;
    auVar30._4_4_ =
         fVar24 * *(float *)((long)&this[3].super_Geometry._vptr_Geometry + 4) +
         *(float *)((long)&(this->super_Geometry)._vptr_Geometry + 4);
    auVar30._8_4_ = fVar25 * this[3].pos.x + (this->pos).x;
    auVar30._12_4_ = fVar26 * this[3].pos.y + (this->pos).y;
    auVar30._16_4_ = fVar27 * this[3].pos.z + (this->pos).z;
    auVar30._20_4_ = fVar28 * this[3].radius + this->radius;
    auVar30._24_4_ = fVar29 * (float)this[3].material_id + (float)this->material_id;
    auVar30._28_4_ = SVar1._28_4_ + *(float *)&this->field_0x1c;
    auVar33._0_4_ =
         fVar22 * *(float *)&this[4].super_Geometry._vptr_Geometry +
         *(float *)&this[1].super_Geometry._vptr_Geometry;
    auVar33._4_4_ =
         fVar24 * *(float *)((long)&this[4].super_Geometry._vptr_Geometry + 4) +
         *(float *)((long)&this[1].super_Geometry._vptr_Geometry + 4);
    auVar33._8_4_ = fVar25 * this[4].pos.x + this[1].pos.x;
    auVar33._12_4_ = fVar26 * this[4].pos.y + this[1].pos.y;
    auVar33._16_4_ = fVar27 * this[4].pos.z + this[1].pos.z;
    auVar33._20_4_ = fVar28 * this[4].radius + this[1].radius;
    auVar33._24_4_ = fVar29 * (float)this[4].material_id + (float)this[1].material_id;
    auVar33._28_4_ = fVar19 + *(float *)&this[1].field_0x1c;
    auVar23._0_4_ =
         fVar22 * *(float *)&this[5].super_Geometry._vptr_Geometry +
         *(float *)&this[2].super_Geometry._vptr_Geometry;
    auVar23._4_4_ =
         fVar24 * *(float *)((long)&this[5].super_Geometry._vptr_Geometry + 4) +
         *(float *)((long)&this[2].super_Geometry._vptr_Geometry + 4);
    auVar23._8_4_ = fVar25 * this[5].pos.x + this[2].pos.x;
    auVar23._12_4_ = fVar26 * this[5].pos.y + this[2].pos.y;
    auVar23._16_4_ = fVar27 * this[5].pos.z + this[2].pos.z;
    auVar23._20_4_ = fVar28 * this[5].radius + this[2].radius;
    auVar23._24_4_ = fVar29 * (float)this[5].material_id + (float)this[2].material_id;
    auVar23._28_4_ = SVar2._28_4_ + *(float *)&this[2].field_0x1c;
    auVar18 = *(undefined1 (*) [32])(ray->d).x;
    auVar16 = vblendvps_avx(*(undefined1 (*) [32])(ray->o).x,auVar30,auVar17);
    *(undefined1 (*) [32])(ray->o).x = auVar16;
    auVar16 = vblendvps_avx(*(undefined1 (*) [32])(ray->o).y,auVar33,auVar17);
    *(undefined1 (*) [32])(ray->o).y = auVar16;
    auVar16 = vblendvps_avx(*(undefined1 (*) [32])(ray->o).z,auVar23,auVar17);
    *(undefined1 (*) [32])(ray->o).z = auVar16;
    auVar16 = vsubps_avx(auVar30,(undefined1  [32])c);
    auVar9 = vsubps_avx(auVar33,(undefined1  [32])b);
    auVar21 = vsubps_avx(auVar23,(undefined1  [32])a);
    auVar16 = vblendvps_avx(auVar18,auVar16,auVar17);
    auVar9 = vblendvps_avx(*(undefined1 (*) [32])(ray->d).y,auVar9,auVar17);
    auVar18 = *(undefined1 (*) [32])(ray->d).z;
    auVar21 = vblendvps_avx(auVar18,auVar21,auVar17);
    fVar19 = auVar16._0_4_;
    fVar24 = auVar16._4_4_;
    auVar13._4_4_ = fVar24 * fVar24;
    auVar13._0_4_ = fVar19 * fVar19;
    fVar26 = auVar16._8_4_;
    auVar13._8_4_ = fVar26 * fVar26;
    fVar28 = auVar16._12_4_;
    auVar13._12_4_ = fVar28 * fVar28;
    fVar32 = auVar16._16_4_;
    auVar13._16_4_ = fVar32 * fVar32;
    fVar5 = auVar16._20_4_;
    auVar13._20_4_ = fVar5 * fVar5;
    fVar7 = auVar16._24_4_;
    auVar13._24_4_ = fVar7 * fVar7;
    auVar13._28_4_ = auVar18._28_4_;
    auVar20 = vfmadd231ps_fma(auVar13,auVar9,auVar9);
    auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar21,auVar21);
    auVar18 = vsqrtps_avx(ZEXT1632(auVar20));
    auVar18 = vrcpps_avx(auVar18);
    fVar22 = auVar18._0_4_;
    fVar25 = auVar18._4_4_;
    fVar27 = auVar18._8_4_;
    fVar29 = auVar18._12_4_;
    fVar4 = auVar18._16_4_;
    fVar6 = auVar18._20_4_;
    fVar8 = auVar18._24_4_;
    (ray->d).x[0] = fVar19 * fVar22;
    (ray->d).x[1] = fVar24 * fVar25;
    (ray->d).x[2] = fVar26 * fVar27;
    (ray->d).x[3] = fVar28 * fVar29;
    (ray->d).x[4] = fVar32 * fVar4;
    (ray->d).x[5] = fVar5 * fVar6;
    (ray->d).x[6] = fVar7 * fVar8;
    (ray->d).x[7] = auVar16._28_4_;
    (ray->d).y[0] = auVar9._0_4_ * fVar22;
    (ray->d).y[1] = auVar9._4_4_ * fVar25;
    (ray->d).y[2] = auVar9._8_4_ * fVar27;
    (ray->d).y[3] = auVar9._12_4_ * fVar29;
    (ray->d).y[4] = auVar9._16_4_ * fVar4;
    (ray->d).y[5] = auVar9._20_4_ * fVar6;
    (ray->d).y[6] = auVar9._24_4_ * fVar8;
    (ray->d).y[7] = auVar16._28_4_;
    (ray->d).z[0] = auVar21._0_4_ * fVar22;
    (ray->d).z[1] = auVar21._4_4_ * fVar25;
    (ray->d).z[2] = auVar21._8_4_ * fVar27;
    (ray->d).z[3] = auVar21._12_4_ * fVar29;
    (ray->d).z[4] = auVar21._16_4_ * fVar4;
    (ray->d).z[5] = auVar21._20_4_ * fVar6;
    (ray->d).z[6] = auVar21._24_4_ * fVar8;
    (ray->d).z[7] = auVar21._28_4_;
    fVar19 = (*__return_storage_ptr__)[6];
    auVar31._4_4_ = fVar19;
    auVar31._0_4_ = fVar19;
    auVar31._8_4_ = fVar19;
    auVar31._12_4_ = fVar19;
    auVar31._16_4_ = fVar19;
    auVar31._20_4_ = fVar19;
    auVar31._24_4_ = fVar19;
    auVar31._28_4_ = fVar19;
    auVar18 = vblendvps_avx(*(undefined1 (*) [32])ray->t_min,auVar31,auVar17);
    *(undefined1 (*) [32])ray->t_min = auVar18;
  }
  return pafVar14;
}

Assistant:

__m256 Sphere::intersect(Ray8 &ray, DiffGeom8 &dg) const {
	const auto center = Vec3f_8{pos};
	const auto d = center - ray.o;
	const auto a = ray.d.length_sqr();
	const auto b = _mm256_mul_ps(ray.d.dot(d), _mm256_set1_ps(-2.f));
	const auto c = _mm256_fnmadd_ps(_mm256_set1_ps(radius), _mm256_set1_ps(radius), d.dot(d));
	// Solve the quadratic equation and store the mask of potential hits
	// We'll update this mask as we discard other potential hits, eg. due to
	// the hit being beyond the ray's t value
	auto t0 = _mm256_set1_ps(0);
	auto t1 = _mm256_set1_ps(0);
	auto hits = solve_quadratic(a, b, c, t0, t1);
	// We want t0 to hold the nearest t value that is greater than ray.t_min
	auto swap_t = _mm256_cmp_ps(t0, ray.t_min, _CMP_LT_OQ);
	t0 = _mm256_blendv_ps(t0, t1, swap_t);
	// Check which hits are within the ray's t range
	auto in_range = _mm256_and_ps(_mm256_cmp_ps(t0, ray.t_min, _CMP_GT_OQ),
			_mm256_cmp_ps(t0, ray.t_max, _CMP_LT_OQ));
	hits = _mm256_and_ps(hits, in_range);
	hits = _mm256_and_ps(hits, ray.active);
	// Check if all rays miss the sphere
	if (_mm256_movemask_ps(hits) == 0){
		return hits;
	}
	// Update t values for rays that did hit
	ray.t_max = _mm256_blendv_ps(ray.t_max, t0, hits);

	const auto point = ray.at(ray.t_max);
	dg.point.x = _mm256_blendv_ps(dg.point.x, point.x, hits);
	dg.point.y = _mm256_blendv_ps(dg.point.y, point.y, hits);
	dg.point.z = _mm256_blendv_ps(dg.point.z, point.z, hits);
	const auto normal = point - center;
	dg.normal.x = _mm256_blendv_ps(dg.normal.x, normal.x, hits);
	dg.normal.y = _mm256_blendv_ps(dg.normal.y, normal.y, hits);
	dg.normal.z = _mm256_blendv_ps(dg.normal.z, normal.z, hits);
	dg.normal.normalize();
	// There's no blendv_epi32 in AVX/AVX2 so we have to resort to some hacky casting
	dg.material_id = _mm256_castps_si256(_mm256_blendv_ps(_mm256_castsi256_ps(dg.material_id),
			_mm256_castsi256_ps(_mm256_set1_epi32(material_id)), hits));
	return hits;
}